

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

ImVec4 ImPlot::GetAutoColor(ImPlotCol idx)

{
  ImVec4 *pIVar1;
  ImVec4 local_ac;
  ImVec4 local_9c;
  ImVec4 local_8c;
  ImVec4 local_7c;
  ImVec4 local_6c;
  ImVec4 local_5c;
  ImVec4 local_4c;
  ImVec4 local_3c;
  undefined1 local_2c [8];
  ImVec4 col;
  ImPlotCol idx_local;
  float local_10;
  float fStack_c;
  
  col.z = (float)idx;
  ImVec4::ImVec4((ImVec4 *)local_2c,0.0,0.0,0.0,1.0);
  switch(col.z) {
  case 0.0:
    local_10 = col.x;
    fStack_c = col.y;
    col.w = (float)local_2c._0_4_;
    idx_local = local_2c._4_4_;
    break;
  case 1.4013e-45:
    local_10 = col.x;
    fStack_c = col.y;
    col.w = (float)local_2c._0_4_;
    idx_local = local_2c._4_4_;
    break;
  case 2.8026e-45:
    local_10 = col.x;
    fStack_c = col.y;
    col.w = (float)local_2c._0_4_;
    idx_local = local_2c._4_4_;
    break;
  case 4.2039e-45:
    local_10 = col.x;
    fStack_c = col.y;
    col.w = (float)local_2c._0_4_;
    idx_local = local_2c._4_4_;
    break;
  case 5.60519e-45:
    pIVar1 = ImGui::GetStyleColorVec4(0);
    unique0x10000271 = *pIVar1;
    break;
  case 7.00649e-45:
    pIVar1 = ImGui::GetStyleColorVec4(7);
    unique0x10000281 = *pIVar1;
    break;
  case 8.40779e-45:
    pIVar1 = ImGui::GetStyleColorVec4(2);
    unique0x10000291 = *pIVar1;
    break;
  case 9.80909e-45:
    pIVar1 = ImGui::GetStyleColorVec4(5);
    unique0x100002a1 = *pIVar1;
    break;
  case 1.12104e-44:
    pIVar1 = ImGui::GetStyleColorVec4(4);
    unique0x100002b1 = *pIVar1;
    break;
  case 1.26117e-44:
    join_0x00001240_0x00001200_ = GetStyleColorVec4(7);
    break;
  case 1.4013e-44:
    join_0x00001240_0x00001200_ = GetStyleColorVec4(0xc);
    break;
  case 1.54143e-44:
    pIVar1 = ImGui::GetStyleColorVec4(0);
    unique0x100002c1 = *pIVar1;
    break;
  case 1.68156e-44:
    pIVar1 = ImGui::GetStyleColorVec4(0);
    unique0x100002d1 = *pIVar1;
    break;
  case 1.82169e-44:
    pIVar1 = ImGui::GetStyleColorVec4(0);
    unique0x100002e1 = *pIVar1;
    break;
  case 1.96182e-44:
    local_3c = GetStyleColorVec4(0xd);
    ImVec4::ImVec4(&local_4c,1.0,1.0,1.0,0.25);
    join_0x00001240_0x00001200_ = ::operator*(&local_3c,&local_4c);
    break;
  case 2.10195e-44:
    pIVar1 = ImGui::GetStyleColorVec4(0);
    unique0x100002f1 = *pIVar1;
    break;
  case 2.24208e-44:
    local_5c = GetStyleColorVec4(0xf);
    ImVec4::ImVec4(&local_6c,1.0,1.0,1.0,0.25);
    join_0x00001240_0x00001200_ = ::operator*(&local_5c,&local_6c);
    break;
  case 2.38221e-44:
    pIVar1 = ImGui::GetStyleColorVec4(0);
    unique0x10000301 = *pIVar1;
    break;
  case 2.52234e-44:
    local_7c = GetStyleColorVec4(0x11);
    ImVec4::ImVec4(&local_8c,1.0,1.0,1.0,0.25);
    join_0x00001240_0x00001200_ = ::operator*(&local_7c,&local_8c);
    break;
  case 2.66247e-44:
    pIVar1 = ImGui::GetStyleColorVec4(0);
    unique0x10000311 = *pIVar1;
    break;
  case 2.8026e-44:
    local_9c = GetStyleColorVec4(0x13);
    ImVec4::ImVec4(&local_ac,1.0,1.0,1.0,0.25);
    join_0x00001240_0x00001200_ = ::operator*(&local_9c,&local_ac);
    break;
  case 2.94273e-44:
    ImVec4::ImVec4((ImVec4 *)&col.w,1.0,1.0,0.0,1.0);
    break;
  case 3.08286e-44:
    ImVec4::ImVec4((ImVec4 *)&col.w,0.0,1.0,0.0,1.0);
    break;
  case 3.22299e-44:
    join_0x00001240_0x00001200_ = GetStyleColorVec4(7);
    break;
  default:
    local_10 = col.x;
    fStack_c = col.y;
    col.w = (float)local_2c._0_4_;
    idx_local = local_2c._4_4_;
  }
  return stack0xffffffffffffffe8;
}

Assistant:

ImVec4 GetAutoColor(ImPlotCol idx) {
    ImVec4 col(0,0,0,1);
    switch(idx) {
        case ImPlotCol_Line:          return col; // these are plot dependent!
        case ImPlotCol_Fill:          return col; // these are plot dependent!
        case ImPlotCol_MarkerOutline: return col; // these are plot dependent!
        case ImPlotCol_MarkerFill:    return col; // these are plot dependent!
        case ImPlotCol_ErrorBar:      return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_FrameBg:       return ImGui::GetStyleColorVec4(ImGuiCol_FrameBg);
        case ImPlotCol_PlotBg:        return ImGui::GetStyleColorVec4(ImGuiCol_WindowBg);
        case ImPlotCol_PlotBorder:    return ImGui::GetStyleColorVec4(ImGuiCol_Border);
        case ImPlotCol_LegendBg:      return ImGui::GetStyleColorVec4(ImGuiCol_PopupBg);
        case ImPlotCol_LegendBorder:  return GetStyleColorVec4(ImPlotCol_PlotBorder);
        case ImPlotCol_LegendText:    return GetStyleColorVec4(ImPlotCol_InlayText);
        case ImPlotCol_TitleText:     return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_InlayText:     return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_XAxis:         return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_XAxisGrid:     return GetStyleColorVec4(ImPlotCol_XAxis) * ImVec4(1,1,1,0.25f);
        case ImPlotCol_YAxis:         return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_YAxisGrid:     return GetStyleColorVec4(ImPlotCol_YAxis) * ImVec4(1,1,1,0.25f);
        case ImPlotCol_YAxis2:        return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_YAxisGrid2:    return GetStyleColorVec4(ImPlotCol_YAxis2) * ImVec4(1,1,1,0.25f);
        case ImPlotCol_YAxis3:        return ImGui::GetStyleColorVec4(ImGuiCol_Text);
        case ImPlotCol_YAxisGrid3:    return GetStyleColorVec4(ImPlotCol_YAxis3) * ImVec4(1,1,1,0.25f);
        case ImPlotCol_Selection:     return ImVec4(1,1,0,1);
        case ImPlotCol_Query:         return ImVec4(0,1,0,1);
        case ImPlotCol_Crosshairs:    return GetStyleColorVec4(ImPlotCol_PlotBorder);
        default: return col;
    }
}